

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O1

void applycalcrule_stepped(profile_rec_new *profile,LossRec *x,int layer,bool isLast)

{
  uchar uVar1;
  pointer ptVar2;
  pointer ptVar3;
  uint uVar4;
  float fVar5;
  OASIS_FLOAT OVar6;
  OASIS_FLOAT OVar7;
  OASIS_FLOAT OVar8;
  OASIS_FLOAT OVar9;
  OASIS_FLOAT OVar10;
  float fVar11;
  OASIS_FLOAT OVar12;
  OASIS_FLOAT OVar13;
  OASIS_FLOAT OVar14;
  float fVar15;
  float fVar16;
  OASIS_FLOAT OVar17;
  OASIS_FLOAT OVar18;
  OASIS_FLOAT OVar19;
  OASIS_FLOAT OVar20;
  OASIS_FLOAT OVar21;
  OASIS_FLOAT OVar22;
  
  uVar4 = profile->calcrule_id;
  switch(uVar4) {
  case 0xc:
    if (x->loss <= 0.0) {
      return;
    }
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      if (ptVar3 == (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      if (ptVar3->tc_id == '\0') break;
      ptVar3 = ptVar3 + 1;
    }
    fVar16 = x->loss - ptVar3->tc_val;
    fVar15 = 0.0;
    if (0.0 <= fVar16) {
      fVar15 = fVar16;
    }
    fVar16 = x->loss - fVar15;
    fVar5 = x->effective_deductible + fVar16;
    x->effective_deductible = fVar5;
    if (x->under_limit <= fVar5 && fVar5 != x->under_limit) {
      x->under_limit = fVar5;
    }
    x->retained_loss = fVar16 + x->retained_loss;
    x->loss = fVar15;
    return;
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x21:
  case 0x23:
  case 0x24:
switchD_0010ba2c_caseD_d:
    fprintf(_stderr,"FATAL: Unknown calc rule %d\n",(ulong)uVar4);
    return;
  case 0xe:
    OVar12 = 0.0;
    for (ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar3 != (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
                  super__Vector_impl_data._M_finish; ptVar3 = ptVar3 + 1) {
      if (ptVar3->tc_id == '\x04') {
        OVar12 = ptVar3->tc_val;
      }
    }
    fVar15 = x->loss;
    fVar16 = fVar15;
    if (OVar12 < fVar15) {
      x->over_limit = fVar15 - OVar12;
      fVar16 = OVar12;
    }
    fVar5 = x->effective_deductible;
    if (x->effective_deductible <= x->under_limit) {
      fVar5 = x->under_limit;
    }
    fVar11 = OVar12 - fVar16;
    if (fVar5 <= OVar12 - fVar16) {
      fVar11 = fVar5;
    }
    x->under_limit = fVar11;
    if (layer < 2) {
      OVar12 = (fVar15 - fVar16) + x->retained_loss;
    }
    else {
      OVar12 = x->previous_layer_retained_loss - fVar16;
    }
    x->retained_loss = OVar12;
    x->loss = fVar16;
    return;
  case 0x1b:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      fVar15 = 1.0;
      OVar12 = 0.0;
      OVar17 = 0.0;
      OVar14 = 0.0;
      OVar13 = 0.0;
      OVar18 = 0.0;
      OVar20 = 0.0;
      OVar6 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar19 = 0.0;
      OVar21 = 0.0;
      OVar10 = 0.0;
      OVar9 = 0.0;
      OVar7 = 0.0;
      OVar8 = 0.0;
      OVar22 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\0') {
          OVar6 = OVar22;
        }
        OVar20 = OVar12;
        if (uVar1 != '\t') {
          OVar20 = OVar8;
        }
        OVar18 = OVar12;
        if (uVar1 != '\n') {
          OVar18 = OVar7;
        }
        OVar13 = OVar12;
        if (uVar1 != '\v') {
          OVar13 = OVar9;
        }
        OVar14 = OVar12;
        if (uVar1 != '\r') {
          OVar14 = fVar15;
        }
        fVar15 = OVar14;
        OVar14 = OVar12;
        if (uVar1 != '\x0e') {
          OVar14 = OVar10;
        }
        OVar17 = OVar12;
        if (uVar1 != '\x04') {
          OVar17 = OVar21;
        }
        if (uVar1 != '\x05') {
          OVar12 = OVar19;
        }
        ptVar3 = ptVar3 + 1;
        OVar19 = OVar12;
        OVar21 = OVar17;
        OVar10 = OVar14;
        OVar9 = OVar13;
        OVar7 = OVar18;
        OVar8 = OVar20;
        OVar22 = OVar6;
      } while (ptVar3 != ptVar2);
      fVar15 = fVar15 + 1.0;
    }
    fVar16 = x->loss / x->accumulated_tiv;
    if ((((OVar18 == 1.0) && (!NAN(OVar18))) || (fVar11 = 0.0, fVar16 < OVar18)) &&
       (fVar11 = 0.0, OVar20 <= fVar16)) {
      fVar5 = OVar13 * x->accumulated_tiv - OVar6;
      fVar16 = 0.0;
      if (0.0 <= fVar5) {
        fVar16 = fVar5;
      }
      if (fVar16 <= OVar17) {
        OVar17 = fVar16;
      }
      if (OVar14 * OVar17 <= OVar12) {
        OVar12 = OVar14 * OVar17;
      }
      fVar11 = fVar15 * (OVar12 + OVar17);
    }
    goto LAB_0010c48d;
  case 0x1c:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      fVar15 = 1.0;
      OVar20 = 0.0;
      OVar13 = 0.0;
      OVar14 = 0.0;
      OVar12 = 0.0;
      OVar17 = 0.0;
      OVar6 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar18 = 0.0;
      OVar19 = 0.0;
      OVar21 = 0.0;
      OVar10 = 0.0;
      OVar9 = 0.0;
      OVar7 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\0') {
          OVar6 = OVar7;
        }
        OVar17 = OVar12;
        if (uVar1 != '\t') {
          OVar17 = OVar10;
        }
        OVar20 = OVar12;
        if (uVar1 != '\n') {
          OVar20 = OVar9;
        }
        OVar13 = OVar12;
        if (uVar1 != '\v') {
          OVar13 = OVar21;
        }
        OVar14 = OVar12;
        if (uVar1 != '\r') {
          OVar14 = fVar15;
        }
        fVar15 = OVar14;
        OVar14 = OVar12;
        if (uVar1 != '\x0e') {
          OVar14 = OVar19;
        }
        if (uVar1 != '\x05') {
          OVar12 = OVar18;
        }
        ptVar3 = ptVar3 + 1;
        OVar18 = OVar12;
        OVar19 = OVar14;
        OVar21 = OVar13;
        OVar10 = OVar17;
        OVar9 = OVar20;
        OVar7 = OVar6;
      } while (ptVar3 != ptVar2);
      fVar15 = fVar15 + 1.0;
    }
    fVar16 = x->loss / x->accumulated_tiv;
    if ((((OVar20 == 1.0) && (!NAN(OVar20))) || (fVar11 = 0.0, fVar16 < OVar20)) &&
       (fVar11 = 0.0, OVar17 <= fVar16)) {
      fVar5 = OVar13 * x->loss - OVar6;
      fVar16 = 0.0;
      if (0.0 <= fVar5) {
        fVar16 = fVar5;
      }
      if (OVar14 * fVar16 <= OVar12) {
        OVar12 = OVar14 * fVar16;
      }
      fVar11 = fVar15 * (OVar12 + fVar16);
    }
    break;
  case 0x1d:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      fVar16 = 1.0;
      fVar15 = 0.0;
      OVar13 = 0.0;
      OVar17 = 0.0;
      OVar6 = 0.0;
      OVar14 = 0.0;
      OVar12 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar20 = 0.0;
      OVar18 = 0.0;
      fVar16 = 0.0;
      OVar19 = 0.0;
      OVar21 = 0.0;
      OVar10 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\0') {
          OVar6 = fVar15;
        }
        fVar15 = OVar6;
        OVar13 = OVar12;
        if (uVar1 != '\t') {
          OVar13 = OVar10;
        }
        OVar17 = OVar12;
        if (uVar1 != '\n') {
          OVar17 = OVar21;
        }
        OVar6 = OVar12;
        if (uVar1 != '\v') {
          OVar6 = OVar19;
        }
        OVar9 = OVar12;
        if (uVar1 != '\r') {
          OVar9 = fVar16;
        }
        OVar14 = OVar12;
        if (uVar1 != '\x0e') {
          OVar14 = OVar18;
        }
        if (uVar1 != '\x05') {
          OVar12 = OVar20;
        }
        ptVar3 = ptVar3 + 1;
        OVar20 = OVar12;
        OVar18 = OVar14;
        fVar16 = OVar9;
        OVar19 = OVar6;
        OVar21 = OVar17;
        OVar10 = OVar13;
      } while (ptVar3 != ptVar2);
      fVar16 = OVar9 + 1.0;
    }
    fVar5 = x->loss / x->accumulated_tiv;
    if ((((OVar17 == 1.0) && (!NAN(OVar17))) || (fVar11 = 0.0, fVar5 < OVar17)) &&
       (fVar11 = 0.0, OVar13 <= fVar5)) {
      fVar11 = OVar6 * x->accumulated_tiv;
LAB_0010c3f7:
      fVar5 = 0.0;
      if (0.0 <= fVar11 - fVar15) {
        fVar5 = fVar11 - fVar15;
      }
LAB_0010c402:
      if (OVar14 * fVar5 <= OVar12) {
        OVar12 = OVar14 * fVar5;
      }
      fVar11 = fVar16 * (OVar12 + fVar5);
    }
    break;
  case 0x1e:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      fVar16 = 1.0;
      fVar15 = 0.0;
      OVar13 = 0.0;
      OVar17 = 0.0;
      OVar6 = 0.0;
      OVar14 = 0.0;
      OVar20 = 0.0;
      OVar12 = 0.0;
    }
    else {
      OVar20 = 0.0;
      fVar15 = 0.0;
      OVar18 = 0.0;
      OVar19 = 0.0;
      fVar16 = 0.0;
      OVar21 = 0.0;
      OVar10 = 0.0;
      OVar9 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\0') {
          OVar6 = fVar15;
        }
        fVar15 = OVar6;
        OVar13 = OVar12;
        if (uVar1 != '\t') {
          OVar13 = OVar9;
        }
        OVar17 = OVar12;
        if (uVar1 != '\n') {
          OVar17 = OVar10;
        }
        OVar6 = OVar12;
        if (uVar1 != '\v') {
          OVar6 = OVar21;
        }
        OVar7 = OVar12;
        if (uVar1 != '\r') {
          OVar7 = fVar16;
        }
        OVar14 = OVar12;
        if (uVar1 != '\x0e') {
          OVar14 = OVar19;
        }
        OVar19 = OVar12;
        if (uVar1 != '\x04') {
          OVar19 = OVar20;
        }
        OVar20 = OVar19;
        if (uVar1 != '\x05') {
          OVar12 = OVar18;
        }
        ptVar3 = ptVar3 + 1;
        OVar18 = OVar12;
        OVar19 = OVar14;
        fVar16 = OVar7;
        OVar21 = OVar6;
        OVar10 = OVar17;
        OVar9 = OVar13;
      } while (ptVar3 != ptVar2);
      fVar16 = OVar7 + 1.0;
    }
    fVar5 = x->loss / x->accumulated_tiv;
    if ((((OVar17 == 1.0) && (!NAN(OVar17))) || (fVar11 = 0.0, fVar5 < OVar17)) &&
       (fVar11 = 0.0, OVar13 <= fVar5)) {
      fVar11 = OVar6 * OVar20;
      goto LAB_0010c3f7;
    }
    break;
  case 0x1f:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      fVar16 = 1.0;
      fVar15 = 0.0;
      OVar6 = 0.0;
      OVar17 = 0.0;
      OVar13 = 0.0;
      OVar14 = 0.0;
      OVar12 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar20 = 0.0;
      OVar18 = 0.0;
      fVar16 = 0.0;
      OVar19 = 0.0;
      OVar21 = 0.0;
      OVar10 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\0') {
          OVar6 = fVar15;
        }
        fVar15 = OVar6;
        OVar6 = OVar12;
        if (uVar1 != '\t') {
          OVar6 = OVar10;
        }
        OVar17 = OVar12;
        if (uVar1 != '\n') {
          OVar17 = OVar21;
        }
        OVar13 = OVar12;
        if (uVar1 != '\v') {
          OVar13 = OVar19;
        }
        OVar9 = OVar12;
        if (uVar1 != '\r') {
          OVar9 = fVar16;
        }
        OVar14 = OVar12;
        if (uVar1 != '\x0e') {
          OVar14 = OVar18;
        }
        if (uVar1 != '\x05') {
          OVar12 = OVar20;
        }
        ptVar3 = ptVar3 + 1;
        OVar20 = OVar12;
        OVar18 = OVar14;
        fVar16 = OVar9;
        OVar19 = OVar13;
        OVar21 = OVar17;
        OVar10 = OVar6;
      } while (ptVar3 != ptVar2);
      fVar16 = OVar9 + 1.0;
    }
    fVar5 = x->loss / x->accumulated_tiv;
    if ((((OVar17 == 1.0) && (!NAN(OVar17))) || (fVar11 = 0.0, fVar5 < OVar17)) &&
       (fVar11 = 0.0, OVar6 <= fVar5)) {
      fVar5 = 0.0;
      if (0.0 <= OVar13 - fVar15) {
        fVar5 = OVar13 - fVar15;
      }
      goto LAB_0010c402;
    }
    break;
  case 0x20:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    OVar12 = 0.0;
    if (ptVar3 == ptVar2) {
      fVar16 = 1.0;
      OVar6 = 0.0;
      OVar13 = 0.0;
      OVar14 = 0.0;
      OVar17 = 0.0;
      fVar15 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar17 = 0.0;
      OVar20 = 0.0;
      fVar16 = 0.0;
      OVar18 = 0.0;
      OVar19 = 0.0;
      do {
        OVar21 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar21;
        if (uVar1 != '\t') {
          OVar6 = OVar19;
        }
        OVar13 = OVar21;
        if (uVar1 != '\v') {
          OVar13 = OVar18;
        }
        OVar10 = OVar21;
        if (uVar1 != '\r') {
          OVar10 = fVar16;
        }
        OVar14 = OVar21;
        if (uVar1 != '\x04') {
          OVar14 = OVar20;
        }
        OVar20 = OVar21;
        if (uVar1 != '\x0e') {
          OVar20 = OVar17;
        }
        OVar17 = OVar20;
        if (uVar1 != '\x05') {
          OVar21 = fVar15;
        }
        fVar15 = OVar21;
        ptVar3 = ptVar3 + 1;
        OVar20 = OVar14;
        fVar16 = OVar10;
        OVar18 = OVar13;
        OVar19 = OVar6;
      } while (ptVar3 != ptVar2);
      fVar16 = OVar10 + 1.0;
    }
    if (OVar6 <= x->loss) {
      fVar5 = OVar13 * x->loss;
      if (fVar5 <= OVar14) {
        OVar14 = fVar5;
      }
      if (OVar17 * OVar14 <= fVar15) {
        fVar15 = OVar17 * OVar14;
      }
      OVar12 = fVar16 * (fVar15 + OVar14);
    }
    if (profile->step_id != 1) {
      OVar12 = OVar12 + x->step_loss;
    }
    x->step_loss = OVar12;
    goto LAB_0010c518;
  case 0x22:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    OVar6 = 0.0;
    OVar12 = 0.0;
    fVar15 = 0.0;
    if (ptVar3 != ptVar2) {
      fVar15 = 0.0;
      OVar13 = 0.0;
      OVar14 = 0.0;
      do {
        OVar17 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar17;
        if (uVar1 != '\0') {
          OVar6 = OVar14;
        }
        OVar12 = OVar17;
        if (uVar1 != '\x06') {
          OVar12 = OVar13;
        }
        if (uVar1 != '\x03') {
          OVar17 = fVar15;
        }
        fVar15 = OVar17;
        ptVar3 = ptVar3 + 1;
        OVar13 = OVar12;
        OVar14 = OVar6;
      } while (ptVar3 != ptVar2);
    }
    fVar16 = x->loss;
    fVar5 = 0.0;
    if (0.0 <= fVar16 - OVar6) {
      fVar5 = fVar16 - OVar6;
    }
    x->effective_deductible = (fVar16 - fVar5) + x->effective_deductible;
    fVar11 = 0.0;
    if (0.0 <= fVar5 - fVar15) {
      fVar11 = fVar5 - fVar15;
    }
    OVar12 = fVar11 * OVar12;
    if (layer < 2) {
      OVar6 = (fVar16 - OVar12) + x->retained_loss;
    }
    else {
      OVar6 = x->previous_layer_retained_loss - OVar12;
    }
    x->retained_loss = OVar6;
    goto LAB_0010c521;
  case 0x25:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      fVar16 = 1.0;
      fVar15 = 0.0;
      OVar13 = 0.0;
      OVar20 = 0.0;
      OVar6 = 0.0;
      OVar14 = 0.0;
      OVar17 = 0.0;
      OVar12 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar18 = 0.0;
      OVar19 = 0.0;
      OVar21 = 0.0;
      fVar16 = 0.0;
      OVar10 = 0.0;
      OVar9 = 0.0;
      OVar7 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\0') {
          OVar6 = fVar15;
        }
        fVar15 = OVar6;
        OVar13 = OVar12;
        if (uVar1 != '\t') {
          OVar13 = OVar7;
        }
        OVar20 = OVar12;
        if (uVar1 != '\n') {
          OVar20 = OVar9;
        }
        OVar6 = OVar12;
        if (uVar1 != '\v') {
          OVar6 = OVar10;
        }
        OVar8 = OVar12;
        if (uVar1 != '\r') {
          OVar8 = fVar16;
        }
        OVar14 = OVar12;
        if (uVar1 != '\x0e') {
          OVar14 = OVar21;
        }
        OVar17 = OVar12;
        if (uVar1 != '\x04') {
          OVar17 = OVar19;
        }
        if (uVar1 != '\x05') {
          OVar12 = OVar18;
        }
        ptVar3 = ptVar3 + 1;
        OVar18 = OVar12;
        OVar19 = OVar17;
        OVar21 = OVar14;
        fVar16 = OVar8;
        OVar10 = OVar6;
        OVar9 = OVar20;
        OVar7 = OVar13;
      } while (ptVar3 != ptVar2);
      fVar16 = OVar8 + 1.0;
    }
    fVar5 = x->loss / x->accumulated_tiv;
    if ((((OVar20 == 1.0) && (!NAN(OVar20))) || (fVar11 = 0.0, fVar5 < OVar20)) &&
       (fVar11 = 0.0, OVar13 <= fVar5)) {
      fVar15 = OVar6 * x->loss - fVar15;
      fVar5 = 0.0;
      if (0.0 <= fVar15) {
        fVar5 = fVar15;
      }
      if (fVar5 <= OVar17) {
        OVar17 = fVar5;
      }
      if (OVar14 * OVar17 <= OVar12) {
        OVar12 = OVar14 * OVar17;
      }
      fVar11 = fVar16 * (OVar12 + OVar17);
    }
LAB_0010c48d:
    if (profile->step_id != 1) {
      fVar11 = fVar11 + x->step_loss;
    }
    x->step_loss = fVar11;
    goto LAB_0010c518;
  case 0x26:
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ptVar3 == ptVar2) {
      OVar6 = 0.0;
      OVar14 = 0.0;
      fVar15 = 0.0;
      OVar13 = 0.0;
      OVar12 = 0.0;
    }
    else {
      fVar15 = 0.0;
      OVar17 = 0.0;
      OVar20 = 0.0;
      OVar18 = 0.0;
      OVar19 = 0.0;
      do {
        OVar12 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar6 = OVar12;
        if (uVar1 != '\t') {
          OVar6 = OVar19;
        }
        OVar14 = OVar12;
        if (uVar1 != '\n') {
          OVar14 = OVar18;
        }
        OVar13 = OVar12;
        if (uVar1 != '\r') {
          OVar13 = fVar15;
        }
        fVar15 = OVar13;
        OVar13 = OVar12;
        if (uVar1 != '\x0e') {
          OVar13 = OVar20;
        }
        if (uVar1 != '\x05') {
          OVar12 = OVar17;
        }
        ptVar3 = ptVar3 + 1;
        OVar17 = OVar12;
        OVar20 = OVar13;
        OVar18 = OVar14;
        OVar19 = OVar6;
      } while (ptVar3 != ptVar2);
    }
    fVar16 = x->loss / x->accumulated_tiv;
    if ((((OVar14 == 1.0) && (!NAN(OVar14))) || (fVar5 = 0.0, fVar16 < OVar14)) &&
       (fVar5 = 0.0, OVar6 <= fVar16)) {
      fVar16 = OVar13 * x->step_loss;
      if (fVar16 <= OVar12) {
        OVar12 = fVar16;
      }
      fVar5 = fVar15 * (x->step_loss + OVar12) + OVar12;
    }
    if (profile->step_id != 1) {
      fVar5 = fVar5 + x->step_loss;
    }
    x->step_loss = fVar5;
    goto LAB_0010c518;
  default:
    if (uVar4 == 100) {
      return;
    }
    if (uVar4 != 2) goto switchD_0010ba2c_caseD_d;
    ptVar3 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (profile->tc_vec).super__Vector_base<tc_rec,_std::allocator<tc_rec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    fVar15 = 0.0;
    OVar12 = 0.0;
    OVar6 = 0.0;
    OVar13 = 0.0;
    if (ptVar3 != ptVar2) {
      fVar15 = 0.0;
      OVar14 = 0.0;
      OVar17 = 0.0;
      OVar20 = 0.0;
      do {
        OVar18 = ptVar3->tc_val;
        uVar1 = ptVar3->tc_id;
        OVar13 = OVar18;
        if (uVar1 != '\0') {
          OVar13 = OVar20;
        }
        OVar6 = OVar18;
        if (uVar1 != '\x04') {
          OVar6 = OVar17;
        }
        OVar12 = OVar18;
        if (uVar1 != '\x06') {
          OVar12 = OVar14;
        }
        if (uVar1 != '\x03') {
          OVar18 = fVar15;
        }
        fVar15 = OVar18;
        ptVar3 = ptVar3 + 1;
        OVar14 = OVar12;
        OVar17 = OVar6;
        OVar20 = OVar13;
      } while (ptVar3 != ptVar2);
    }
    fVar16 = x->loss;
    fVar5 = 0.0;
    if (0.0 <= fVar16 - OVar13) {
      fVar5 = fVar16 - OVar13;
    }
    x->effective_deductible = (fVar16 - fVar5) + x->effective_deductible;
    uVar4 = -(uint)(fVar15 + OVar6 < fVar5);
    fVar5 = (float)(~uVar4 & (uint)(fVar5 - fVar15) | (uint)OVar6 & uVar4);
    fVar15 = 0.0;
    if (0.0 <= fVar5) {
      fVar15 = fVar5;
    }
    OVar12 = fVar15 * OVar12;
    if (layer < 2) {
      OVar6 = (fVar16 - OVar12) + x->retained_loss;
    }
    else {
      OVar6 = x->previous_layer_retained_loss - OVar12;
    }
    x->retained_loss = OVar6;
    goto LAB_0010c521;
  }
  if (profile->step_id != 1) {
    fVar11 = fVar11 + x->step_loss;
  }
  x->step_loss = fVar11;
LAB_0010c518:
  if (isLast) {
    OVar12 = x->step_loss;
LAB_0010c521:
    x->loss = OVar12;
  }
  return;
}

Assistant:

void applycalcrule_stepped(const profile_rec_new& profile, LossRec& x, int layer,bool isLast)
{
	switch (profile.calcrule_id) {
	case 2:
	{
		OASIS_FLOAT ded = 0;
		OASIS_FLOAT lim = 0;
		OASIS_FLOAT share = 0;
		OASIS_FLOAT att = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) ded = y.tc_val;
			if (y.tc_id == limit_1) lim = y.tc_val;
			if (y.tc_id == share_1) share = y.tc_val;
			if (y.tc_id == attachment_1) att = y.tc_val;
		}
		//Function2: deductible applies before attachment limit share
		//IIf(Loss < Ded, 0, Loss - Ded)
		//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
		OASIS_FLOAT loss = 0;
		loss = x.loss - ded;
		if (loss < 0) loss = 0;
		x.effective_deductible = x.effective_deductible + (x.loss - loss);
		if (loss > (att + lim)) loss = lim;
		else loss = loss - att;
		if (loss < 0) loss = 0;
		loss = loss * share;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;

		x.loss = loss;
	}
	break;
	case 12:
	{
		if (x.loss > 0) {
			for (auto& z : profile.tc_vec) {
				if (z.tc_id == deductible_1) {
					OASIS_FLOAT loss = x.loss - z.tc_val;
					if (loss < 0) loss = 0;
					x.effective_deductible = x.effective_deductible + (x.loss - loss);
					if (x.effective_deductible > x.under_limit) x.under_limit = x.effective_deductible;
					x.retained_loss = x.retained_loss + (x.loss - loss);
					x.loss = loss;
					break;
				}
			}
		}
	}
	break;
	case 14:
	{
		OASIS_FLOAT lim = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == limit_1) lim = y.tc_val;
		}
		//Function14 =  IIf(Loss > lim, Lim, Loss)
		OASIS_FLOAT loss = x.loss;
			if (loss > lim) {
				x.over_limit = loss - lim;
				loss = lim;
			}
		OASIS_FLOAT under_limit = 0;
		under_limit = x.under_limit;
		if (x.effective_deductible > under_limit) under_limit = x.effective_deductible;
		if (lim - loss < under_limit) under_limit = lim - loss;
		x.under_limit = under_limit;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;
		x.loss = loss;
	}
	break;
	case 27:
	{
		OASIS_FLOAT deductible1 = 0;
		OASIS_FLOAT tstart = 0;
		OASIS_FLOAT tend = 0;
		OASIS_FLOAT payout = 0;
		OASIS_FLOAT scale1 = 0;
		OASIS_FLOAT scale2 = 0;
		OASIS_FLOAT limit1 = 0;
		OASIS_FLOAT limit2 = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) deductible1 = y.tc_val;
			if (y.tc_id == trigger_start) tstart = y.tc_val;
			if (y.tc_id == trigger_end) tend = y.tc_val;
			if (y.tc_id == payout_start) payout = y.tc_val;
			if (y.tc_id == scale_1) scale1 = y.tc_val;
			if (y.tc_id == scale_2) scale2 = y.tc_val;
			if (y.tc_id == limit_1) limit1 = y.tc_val;
			if (y.tc_id == limit_2) limit2 = y.tc_val;

		}
		// Step policy: single step with % loss tiv payout and limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
		OASIS_FLOAT loss = 0;
		OASIS_FLOAT condloss = 0;
		loss = x.loss / x.accumulated_tiv;
		if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
			if (loss >= tstart) {
				loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
				if (loss < 0) loss = 0;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1); // gross up for debris removal
			}
				else loss = 0;
		}
		else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
			if (loss < tend) {
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else loss = 0;
		}

		if (profile.step_id == 1) {
			x.step_loss = loss;
		}
		else {
			x.step_loss = x.step_loss + loss;
		}
		if (isLast == true) {
			x.loss = x.step_loss;
		}
	}
	break;
		case 28:
		{		
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			

			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;				
			}
			// Step policy: single (final) step with % loss payout, no limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 29:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % loss tiv payout, no limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 30:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % limit payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * limit1) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * limit1) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 31:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with monetary amount payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = payout - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = payout - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 32:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;

			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: franchise trigger as a monetary amount with % loss payout, a limit amount and optional extra expenses and scale up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			if (x.loss >= tstart) {
				loss = payout * x.loss;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1);
			}
			else loss = 0;
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}


		}
		break;
		case 34:
		{
			OASIS_FLOAT ded = 0;
			OASIS_FLOAT share = 0;
			OASIS_FLOAT att = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) ded = y.tc_val;
				if (y.tc_id == share_1) share = y.tc_val;
				if (y.tc_id == attachment_1) att = y.tc_val;
			}
			//Function2: deductible applies before attachment limit share
			//IIf(Loss < Ded, 0, Loss - Ded)
			//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
			OASIS_FLOAT loss = 0;
			loss = x.loss - ded;
			if (loss < 0) loss = 0;
			x.effective_deductible = x.effective_deductible + (x.loss - loss);
			loss = loss - att;
			if (loss < 0) loss = 0;
			loss = loss * share;
			//x.retained_loss = x.retained_loss + (x.loss - loss);
			OASIS_FLOAT net_loss = 0;
			if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
			else net_loss = x.retained_loss + (x.loss - loss);
			x.retained_loss = net_loss;
			x.loss = loss;
		}
		break;
		case 37:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: single (final) step with % loss payout and limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						if (loss > limit1) loss = limit1;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 38:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: conditional payouts only, triggered by loss % TIV.  Extra expense payout with limit amount, and a gross up factor for debris removal, with payout based on prior step payout
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT trigger = 0;
			OASIS_FLOAT condloss = 0;
			OASIS_FLOAT debrisloss = 0;
			trigger = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (trigger >= tstart) {
					condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
					loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (trigger < tend) {
					if (trigger >= tstart) {
						condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
						loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 100:	// noop
		{
			x.loss = x.loss;
		}
		break;
		default:
		{
			fprintf(stderr, "FATAL: Unknown calc rule %d\n", profile.calcrule_id);
		}
	}
}